

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

clip_ctx * clip_init(char *fname,clip_context_params ctx_params)

{
  clip_ctx *pcVar1;
  undefined8 in_RSI;
  exception *e;
  clip_model_loader loader;
  clip_ctx *ctx_clip;
  clip_ctx *in_stack_000001b0;
  char *in_stack_000001b8;
  clip_model_loader *in_stack_000001c0;
  clip_model_loader *in_stack_000004b0;
  clip_model_loader *in_stack_000015d0;
  clip_model_loader *in_stack_ffffffffffffff70;
  undefined4 uStack_c;
  
  uStack_c = (ggml_log_level)((ulong)in_RSI >> 0x20);
  g_logger_state.verbosity_thold = uStack_c;
  pcVar1 = (clip_ctx *)operator_new(0x3b0);
  clip_ctx::clip_ctx((clip_ctx *)loader.fname._0_8_,(clip_context_params *)loader.ctx_clip);
  clip_model_loader::clip_model_loader(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  clip_model_loader::load_hparams(in_stack_000004b0);
  clip_model_loader::load_tensors(in_stack_000015d0);
  clip_model_loader::alloc_compute_meta((clip_model_loader *)e);
  clip_model_loader::~clip_model_loader(in_stack_ffffffffffffff70);
  return pcVar1;
}

Assistant:

struct clip_ctx * clip_init(const char * fname, struct clip_context_params ctx_params) {
    g_logger_state.verbosity_thold = ctx_params.verbosity;
    clip_ctx * ctx_clip = new clip_ctx(ctx_params);

    try {
        clip_model_loader loader(fname, *ctx_clip);
        loader.load_hparams();
        loader.load_tensors();
        loader.alloc_compute_meta();
    } catch (const std::exception & e) {
        LOG_ERR("%s: failed to load model '%s': %s\n", __func__, fname, e.what());
        delete ctx_clip;
        return nullptr;
    }

    return ctx_clip;
}